

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcAnnotationSymbolOccurrence).
                              super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18);
  plVar1 = (long *)((this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
                    super_IfcStyledItem.Name.ptr.field_2._M_local_buf + lVar2);
  plVar1[-0xb] = 0x87edb0;
  plVar1[10] = 0x87ee00;
  plVar1[-9] = 0x87edd8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  pvVar3 = *(void **)(&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
                       super_IfcStyledItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 +
                     lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(&(this->super_IfcAnnotationSymbolOccurrence).
                                      super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x40 +
                                    lVar2) - (long)pvVar3);
    return;
  }
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}